

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void fftBRInit(long M,short *BRLow)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = 1L << ((ulong)((int)(M / 2) - 1) & 0x3f);
  for (uVar2 = 0; uVar2 != (~((long)uVar1 >> 0x3f) & uVar1); uVar2 = uVar2 + 1) {
    lVar3 = 0;
    uVar4 = 1;
    for (uVar5 = 1; (long)uVar5 < M / 2; uVar5 = uVar5 + 1) {
      lVar6 = (long)uVar1 >> (uVar5 & 0x3f);
      if ((uVar4 & uVar2) == 0) {
        lVar6 = 0;
      }
      uVar4 = uVar4 * 2;
      lVar3 = lVar3 + lVar6;
    }
    BRLow[uVar2] = (short)lVar3;
  }
  return;
}

Assistant:

void fftBRInit(long M, short *BRLow){
/* Compute BRLow, the bit reversed table for ffts	*/
/* of size pow(2,M/2 -1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *BRLow = bit reversed counter table	*/
long	Mroot_1 = M / 2 - 1;
long	Nroot_1 = POW2(Mroot_1);
long i1;
long bitsum;
long bitmask;
long bit;
for (i1 = 0; i1 < Nroot_1; i1++){
	bitsum = 0;
	bitmask = 1;
	for (bit=1; bit <= Mroot_1; bitmask<<=1, bit++)
		if (i1 & bitmask)
			bitsum = bitsum + (Nroot_1 >> bit);
	BRLow[i1] = bitsum;
};
}